

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::UninterpretedOption_NamePart::RequiredFieldsByteSizeFallback
          (UninterpretedOption_NamePart *this)

{
  bool bVar1;
  size_t total_size;
  undefined8 local_10;
  
  local_10 = 0;
  bVar1 = has_name_part((UninterpretedOption_NamePart *)0x52fc50);
  if (bVar1) {
    _internal_name_part_abi_cxx11_((UninterpretedOption_NamePart *)0x52fc5f);
    local_10 = internal::WireFormatLite::StringSize((string *)0x52fc67);
    local_10 = local_10 + 1;
  }
  bVar1 = has_is_extension((UninterpretedOption_NamePart *)0x52fc7e);
  if (bVar1) {
    local_10 = local_10 + 2;
  }
  return local_10;
}

Assistant:

size_t UninterpretedOption_NamePart::RequiredFieldsByteSizeFallback() const {
// @@protoc_insertion_point(required_fields_byte_size_fallback_start:google.protobuf.UninterpretedOption.NamePart)
  size_t total_size = 0;

  if (has_name_part()) {
    // required string name_part = 1;
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_name_part());
  }

  if (has_is_extension()) {
    // required bool is_extension = 2;
    total_size += 1 + 1;
  }

  return total_size;
}